

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void google::protobuf::compiler::cpp::anon_unknown_0::
     PrintFieldComment<google::protobuf::FieldDescriptor>(Printer *printer,FieldDescriptor *field)

{
  string def;
  DebugStringOptions local_53;
  string local_50;
  string local_30;
  
  local_53.include_comments = false;
  local_53.elide_group_body = true;
  local_53.elide_oneof_body = true;
  FieldDescriptor::DebugStringWithOptions_abi_cxx11_(&local_30,field,&local_53);
  std::__cxx11::string::find((char)&local_30,10);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_30);
  io::Printer::Print(printer,"// $def$\n","def",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrintFieldComment(io::Printer* printer, const T* field) {
  // Print the field's (or oneof's) proto-syntax definition as a comment.
  // We don't want to print group bodies so we cut off after the first
  // line.
  DebugStringOptions options;
  options.elide_group_body = true;
  options.elide_oneof_body = true;
  string def = field->DebugStringWithOptions(options);
  printer->Print("// $def$\n",
    "def", def.substr(0, def.find_first_of('\n')));
}